

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

Vec_Str_t * Saig_SynchSequence(Aig_Man_t *pAig,int nWords)

{
  int iVar1;
  int local_54;
  int local_50;
  int t;
  int s;
  int RetValue;
  int iPatBest;
  int nTerCur2;
  int nTerCur;
  int nTerPrev;
  Vec_Ptr_t *vSimInfo;
  Vec_Str_t *vSequence;
  int fVerify;
  int nTriesMax;
  int nStepsMax;
  int nWords_local;
  Aig_Man_t *pAig_local;
  
  fVerify = 100;
  vSequence._4_4_ = 100;
  vSequence._0_4_ = 1;
  iPatBest = 0;
  nTriesMax = nWords;
  _nStepsMax = pAig;
  iVar1 = Saig_ManRegNum(pAig);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                  ,0x19c,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
  }
  Aig_ManRandom(1);
  iVar1 = Saig_ManRegNum(_nStepsMax);
  vSimInfo = (Vec_Ptr_t *)Vec_StrAlloc(iVar1 * 0x14);
  iVar1 = Aig_ManObjNumMax(_nStepsMax);
  _nTerCur = Vec_PtrAllocSimInfo(iVar1,nTriesMax);
  Saig_SynchSetConstant1(_nStepsMax,_nTerCur,nTriesMax);
  nTerCur2 = Saig_ManRegNum(_nStepsMax);
  Saig_SynchInitRegsTernary(_nStepsMax,_nTerCur,nTriesMax);
  for (local_50 = 0; local_50 < fVerify && 0 < nTerCur2; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < vSequence._4_4_; local_54 = local_54 + 1) {
      Saig_SynchInitPisRandom(_nStepsMax,_nTerCur,nTriesMax);
      Saig_SynchTernarySimulate(_nStepsMax,_nTerCur,nTriesMax);
      iPatBest = Saig_SynchCountX(_nStepsMax,_nTerCur,nTriesMax,&s);
      if (iPatBest < nTerCur2) break;
    }
    if (local_54 == vSequence._4_4_) break;
    RetValue = Saig_SynchSavePattern(_nStepsMax,_nTerCur,nTriesMax,s,(Vec_Str_t *)vSimInfo);
    if (iPatBest != RetValue) {
      __assert_fail("nTerCur == nTerCur2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                    ,0x1b4,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
    }
    nTerCur2 = iPatBest;
  }
  if (nTerCur2 < 1) {
    if ((int)vSequence != 0) {
      iVar1 = Saig_SynchSequenceRun(_nStepsMax,_nTerCur,(Vec_Str_t *)vSimInfo,1);
      if (iVar1 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigSynch.c"
                      ,0x1c2,"Vec_Str_t *Saig_SynchSequence(Aig_Man_t *, int)");
      }
      Aig_ManCleanMarkA(_nStepsMax);
    }
    Vec_PtrFree(_nTerCur);
    pAig_local = (Aig_Man_t *)vSimInfo;
  }
  else {
    printf("Count not initialize %d registers.\n",(ulong)(uint)nTerCur2);
    Vec_PtrFree(_nTerCur);
    Vec_StrFree((Vec_Str_t *)vSimInfo);
    pAig_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Str_t *)pAig_local;
}

Assistant:

Vec_Str_t * Saig_SynchSequence( Aig_Man_t * pAig, int nWords )
{
    int nStepsMax = 100;  // the maximum number of simulation steps
    int nTriesMax = 100;  // the maximum number of attempts at each step
    int fVerify   =   1;  // verify the resulting pattern
    Vec_Str_t * vSequence;
    Vec_Ptr_t * vSimInfo;
    int nTerPrev, nTerCur = 0, nTerCur2;
    int iPatBest, RetValue, s, t;
    assert( Saig_ManRegNum(pAig) > 0 );
    // reset random numbers
    Aig_ManRandom( 1 );
    // start the sequence
    vSequence = Vec_StrAlloc( 20 * Saig_ManRegNum(pAig) );
    // create sim info and init registers
    vSimInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(pAig), nWords );
    Saig_SynchSetConstant1( pAig, vSimInfo, nWords );
    // iterate over the timeframes
    nTerPrev = Saig_ManRegNum(pAig);
    Saig_SynchInitRegsTernary( pAig, vSimInfo, nWords );
    for ( s = 0; s < nStepsMax && nTerPrev > 0; s++ )
    {
        for ( t = 0; t < nTriesMax; t++ )
        {
            Saig_SynchInitPisRandom( pAig, vSimInfo, nWords );
            Saig_SynchTernarySimulate( pAig, vSimInfo, nWords );
            nTerCur = Saig_SynchCountX( pAig, vSimInfo, nWords, &iPatBest );
            if ( nTerCur < nTerPrev )
                break;
        }
        if ( t == nTriesMax )
            break;
        nTerCur2 = Saig_SynchSavePattern( pAig, vSimInfo, nWords, iPatBest, vSequence );
        assert( nTerCur == nTerCur2 );
        nTerPrev = nTerCur;
    }
    if ( nTerPrev > 0 )
    {
        printf( "Count not initialize %d registers.\n", nTerPrev );
        Vec_PtrFree( vSimInfo );
        Vec_StrFree( vSequence );
        return NULL;
    }
    // verify that the sequence is correct
    if ( fVerify )
    {
        RetValue = Saig_SynchSequenceRun( pAig, vSimInfo, vSequence, 1 );
        assert( RetValue == 0 );
        Aig_ManCleanMarkA( pAig );
    }
    Vec_PtrFree( vSimInfo );
    return vSequence;
}